

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAbstractTableElement.cpp
# Opt level: O1

void __thiscall
KDReports::AbstractTableElement::AbstractTableElement
          (AbstractTableElement *this,AbstractTableElement *other)

{
  AbstractTableElementPrivate *pAVar1;
  int *piVar2;
  qreal qVar3;
  AbstractTableElementPrivate *pAVar4;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__AbstractTableElement_001742e0;
  pAVar4 = (AbstractTableElementPrivate *)operator_new(0x58);
  pAVar1 = (other->d)._M_t.
           super___uniq_ptr_impl<KDReports::AbstractTableElementPrivate,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::AbstractTableElementPrivate_*,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
           .super__Head_base<0UL,_KDReports::AbstractTableElementPrivate_*,_false>._M_head_impl;
  pAVar4->m_border = pAVar1->m_border;
  QBrush::QBrush(&pAVar4->m_borderBrush,&pAVar1->m_borderBrush);
  pAVar4->m_unit = pAVar1->m_unit;
  qVar3 = pAVar1->m_width;
  pAVar4->m_padding = pAVar1->m_padding;
  pAVar4->m_width = qVar3;
  QFont::QFont(&pAVar4->m_defaultFont,&pAVar1->m_defaultFont);
  pAVar4->m_fontSpecified = pAVar1->m_fontSpecified;
  piVar2 = (int *)(pAVar1->m_constraints).d.d;
  (pAVar4->m_constraints).d.d = (Data *)piVar2;
  *(ColumnConstraint **)((long)&(pAVar4->m_constraints).d + 8) =
       *(ColumnConstraint **)((long)&(pAVar1->m_constraints).d + 8);
  *(qsizetype *)((long)&(pAVar4->m_constraints).d + 0x10) =
       *(qsizetype *)((long)&(pAVar1->m_constraints).d + 0x10);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::AbstractTableElementPrivate,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::AbstractTableElementPrivate_*,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
  .super__Head_base<0UL,_KDReports::AbstractTableElementPrivate_*,_false>._M_head_impl = pAVar4;
  return;
}

Assistant:

KDReports::AbstractTableElement::AbstractTableElement(const AbstractTableElement &other)
    : Element(other)
    , d(new AbstractTableElementPrivate(*other.d))
{
}